

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O2

U32 ZSTD_finalizeOffCode(U32 rawOffset,U32 *rep,U32 ll0)

{
  U32 UVar1;
  
  if ((ll0 == 0) && (*rep == rawOffset)) {
    return 0;
  }
  if (rep[1] == rawOffset) {
    UVar1 = 2;
  }
  else {
    if (rep[2] != rawOffset) {
      if ((ll0 != 0) && (*rep - 1 == rawOffset)) {
        return 2;
      }
      goto LAB_001a7dc2;
    }
    UVar1 = 3;
  }
  if (UVar1 != ll0) {
    return UVar1 + ~ll0;
  }
LAB_001a7dc2:
  return rawOffset + 2;
}

Assistant:

static U32 ZSTD_finalizeOffCode(U32 rawOffset, const U32 rep[ZSTD_REP_NUM], U32 ll0) {
    U32 offCode = rawOffset + ZSTD_REP_MOVE;
    U32 repCode = 0;

    if (!ll0 && rawOffset == rep[0]) {
        repCode = 1;
    } else if (rawOffset == rep[1]) {
        repCode = 2 - ll0;
    } else if (rawOffset == rep[2]) {
        repCode = 3 - ll0;
    } else if (ll0 && rawOffset == rep[0] - 1) {
        repCode = 3;
    }
    if (repCode) {
        /* ZSTD_storeSeq expects a number in the range [0, 2] to represent a repcode */
        offCode = repCode - 1;
    }
    return offCode;
}